

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O0

int sasl_frame_codec_encode_frame
              (SASL_FRAME_CODEC_HANDLE sasl_frame_codec,AMQP_VALUE sasl_frame_value,
              ON_BYTES_ENCODED on_bytes_encoded,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG p_Var3;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  PAYLOAD payload;
  LOGGER_LOG l_6;
  uchar *sasl_frame_bytes;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t encoded_size;
  uint64_t sasl_frame_descriptor_ulong;
  AMQP_VALUE descriptor;
  LOGGER_LOG l;
  SASL_FRAME_CODEC_INSTANCE *sasl_frame_codec_instance;
  void *pvStack_28;
  int result;
  void *callback_context_local;
  ON_BYTES_ENCODED on_bytes_encoded_local;
  AMQP_VALUE sasl_frame_value_local;
  SASL_FRAME_CODEC_HANDLE sasl_frame_codec_local;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  l = (LOGGER_LOG)sasl_frame_codec;
  pvStack_28 = callback_context;
  callback_context_local = on_bytes_encoded;
  on_bytes_encoded_local = (ON_BYTES_ENCODED)sasl_frame_value;
  sasl_frame_value_local = (AMQP_VALUE)sasl_frame_codec;
  if ((sasl_frame_codec == (SASL_FRAME_CODEC_HANDLE)0x0) || (sasl_frame_value == (AMQP_VALUE)0x0)) {
    descriptor = (AMQP_VALUE)xlogging_get_log_function();
    if (descriptor != (AMQP_VALUE)0x0) {
      (*(code *)descriptor)
                (0,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                 ,"sasl_frame_codec_encode_frame",0xf7,1,
                 "Bad arguments: sasl_frame_codec = %p, sasl_frame_value = %p",
                 sasl_frame_value_local,on_bytes_encoded_local);
    }
    sasl_frame_codec_instance._4_4_ = 0xf8;
  }
  else {
    sasl_frame_descriptor_ulong = (uint64_t)amqpvalue_get_inplace_descriptor(sasl_frame_value);
    if ((AMQP_VALUE)sasl_frame_descriptor_ulong == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                  ,"sasl_frame_codec_encode_frame",0x103,1,
                  "Cannot get SASL frame descriptor AMQP value");
      }
      sasl_frame_codec_instance._4_4_ = 0x104;
    }
    else {
      iVar1 = amqpvalue_get_ulong((AMQP_VALUE)sasl_frame_descriptor_ulong,&encoded_size);
      if (iVar1 == 0) {
        if ((encoded_size < 0x40) || (0x44 < encoded_size)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                      ,"sasl_frame_codec_encode_frame",0x111,1,"Bad SASL frame descriptor");
          }
          sasl_frame_codec_instance._4_4_ = 0x112;
        }
        else {
          iVar1 = amqpvalue_get_encoded_size((AMQP_VALUE)on_bytes_encoded_local,(size_t *)&l_1);
          if (iVar1 == 0) {
            if ((l_1 == (LOGGER_LOG)0x0) || ((LOGGER_LOG)0x1f8 < l_1)) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                          ,"sasl_frame_codec_encode_frame",0x121,1,
                          "SASL frame encoded size out of bounds (%u)",CONCAT44(uVar4,(int)l_1));
              }
              sasl_frame_codec_instance._4_4_ = 0x122;
            }
            else {
              p_Var2 = (LOGGER_LOG)malloc((size_t)l_1);
              if (p_Var2 == (LOGGER_LOG)0x0) {
                payload.length = (size_t)xlogging_get_log_function();
                if ((LOGGER_LOG)payload.length != (LOGGER_LOG)0x0) {
                  (*(code *)payload.length)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                             ,"sasl_frame_codec_encode_frame",0x129,1,
                             "Cannot allocate SASL frame bytes");
                }
                sasl_frame_codec_instance._4_4_ = 0x12a;
              }
              else {
                payload.bytes = (uchar *)0x0;
                l_7 = p_Var2;
                iVar1 = amqpvalue_encode((AMQP_VALUE)on_bytes_encoded_local,encode_bytes,&l_7);
                if (iVar1 == 0) {
                  iVar1 = frame_codec_encode_frame
                                    (*(FRAME_CODEC_HANDLE *)l,'\x01',(PAYLOAD *)&l_7,1,(uchar *)0x0,
                                     0,(ON_BYTES_ENCODED)callback_context_local,pvStack_28);
                  if (iVar1 == 0) {
                    sasl_frame_codec_instance._4_4_ = 0;
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                                ,"sasl_frame_codec_encode_frame",0x142,1,"Cannot encode SASL frame")
                      ;
                    }
                    sasl_frame_codec_instance._4_4_ = 0x143;
                  }
                }
                else {
                  p_Var3 = xlogging_get_log_function();
                  if (p_Var3 != (LOGGER_LOG)0x0) {
                    (*p_Var3)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                              ,"sasl_frame_codec_encode_frame",0x135,1,
                              "Cannot encode SASL frame value");
                  }
                  sasl_frame_codec_instance._4_4_ = 0x136;
                }
                free(p_Var2);
              }
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                        ,"sasl_frame_codec_encode_frame",0x119,1,
                        "Cannot get SASL frame encoded size");
            }
            sasl_frame_codec_instance._4_4_ = 0x11a;
          }
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                    ,"sasl_frame_codec_encode_frame",0x109,1,
                    "Cannot get SASL frame descriptor ulong");
        }
        sasl_frame_codec_instance._4_4_ = 0x10a;
      }
    }
  }
  return sasl_frame_codec_instance._4_4_;
}

Assistant:

int sasl_frame_codec_encode_frame(SASL_FRAME_CODEC_HANDLE sasl_frame_codec, AMQP_VALUE sasl_frame_value, ON_BYTES_ENCODED on_bytes_encoded, void* callback_context)
{
    int result;
    SASL_FRAME_CODEC_INSTANCE* sasl_frame_codec_instance = (SASL_FRAME_CODEC_INSTANCE*)sasl_frame_codec;

    /* Codes_SRS_SASL_FRAME_CODEC_01_030: [If sasl_frame_codec or sasl_frame_value is NULL, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
    if ((sasl_frame_codec == NULL) ||
        (sasl_frame_value == NULL))
    {
        /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
        LogError("Bad arguments: sasl_frame_codec = %p, sasl_frame_value = %p",
            sasl_frame_codec, sasl_frame_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE descriptor;
        uint64_t sasl_frame_descriptor_ulong;
        size_t encoded_size;

        if ((descriptor = amqpvalue_get_inplace_descriptor(sasl_frame_value)) == NULL)
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Cannot get SASL frame descriptor AMQP value");
            result = MU_FAILURE;
        }
        else if (amqpvalue_get_ulong(descriptor, &sasl_frame_descriptor_ulong) != 0)
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Cannot get SASL frame descriptor ulong");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASL_FRAME_CODEC_01_047: [The frame body of a SASL frame MUST contain exactly one AMQP type, whose type encoding MUST have provides="sasl-frame".] */
        else if ((sasl_frame_descriptor_ulong < SASL_MECHANISMS) ||
            (sasl_frame_descriptor_ulong > SASL_OUTCOME))
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Bad SASL frame descriptor");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASL_FRAME_CODEC_01_032: [The payload frame size shall be computed based on the encoded size of the sasl_frame_value and its fields.] */
        /* Codes_SRS_SASL_FRAME_CODEC_01_033: [The encoded size of the sasl_frame_value and its fields shall be obtained by calling amqpvalue_get_encoded_size.] */
        else if (amqpvalue_get_encoded_size(sasl_frame_value, &encoded_size) != 0)
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("Cannot get SASL frame encoded size");
            result = MU_FAILURE;
        }
        /* Codes_SRS_SASL_FRAME_CODEC_01_016: [The maximum size of a SASL frame is defined by MIN-MAX-FRAME-SIZE.] */
        /* Codes_SRS_SASL_FRAME_CODEC_01_017: [The minimum size of a SASL frame is defined by MIN_FRAME_SIZE (1 byte).] */
        else if (encoded_size < MIN_FRAME_SIZE || encoded_size > (MIX_MAX_FRAME_SIZE - 8))
        {
            /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
            LogError("SASL frame encoded size out of bounds (%u)", (unsigned int)encoded_size);
            result = MU_FAILURE;
        }
        else
        {
            unsigned char* sasl_frame_bytes = (unsigned char*)malloc(encoded_size);
            if (sasl_frame_bytes == NULL)
            {
                LogError("Cannot allocate SASL frame bytes");
                result = MU_FAILURE;
            }
            else
            {
                PAYLOAD payload;

                payload.bytes = sasl_frame_bytes;
                payload.length = 0;

                if (amqpvalue_encode(sasl_frame_value, encode_bytes, &payload) != 0)
                {
                    LogError("Cannot encode SASL frame value");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_SRS_SASL_FRAME_CODEC_01_031: [sasl_frame_codec_encode_frame shall encode the frame header and its contents by using frame_codec_encode_frame.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_012: [Bytes 6 and 7 of the header are ignored.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_013: [Implementations SHOULD set these to 0x00.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_014: [The extended header is ignored.] */
                    /* Codes_SRS_SASL_FRAME_CODEC_01_015: [Implementations SHOULD therefore set DOFF to 0x02.] */
                    if (frame_codec_encode_frame(sasl_frame_codec_instance->frame_codec, FRAME_TYPE_SASL, &payload, 1, NULL, 0, on_bytes_encoded, callback_context) != 0)
                    {
                        /* Codes_SRS_SASL_FRAME_CODEC_01_034: [If any error occurs during encoding, sasl_frame_codec_encode_frame shall fail and return a non-zero value.] */
                        LogError("Cannot encode SASL frame");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }

                free(sasl_frame_bytes);
            }
        }
    }

    return result;
}